

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::DescriptorPool::Tables::AddFile(Tables *this,FileDescriptor *file)

{
  bool bVar1;
  first_type local_20;
  FileDescriptor *local_18;
  
  local_20 = (first_type)**(undefined8 **)file;
  local_18 = file;
  bVar1 = InsertIfNotPresent<std::unordered_map<char_const*,google::protobuf::FileDescriptor_const*,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::FileDescriptor_const*>>>>
                    (&this->files_by_name_,&local_20,&local_18);
  if (bVar1) {
    local_20 = (first_type)**(undefined8 **)local_18;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->files_after_checkpoint_,
               &local_20);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddFile(const FileDescriptor* file) {
  if (InsertIfNotPresent(&files_by_name_, file->name().c_str(), file)) {
    files_after_checkpoint_.push_back(file->name().c_str());
    return true;
  } else {
    return false;
  }
}